

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7_test.cc
# Opt level: O2

void __thiscall PKCS7Test_CrlReparse_Test::TestBody(PKCS7Test_CrlReparse_Test *this)

{
  string local_28;
  
  GetTestData_abi_cxx11_(&local_28,"crypto/pkcs7/test/openssl_crl.p7c");
  TestCRLReparse((Span<const_unsigned_char>)local_28._0_16_);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

TEST(PKCS7Test, CrlReparse) {
  // openssl_crl.p7c is the Equifax CRL, converted to PKCS#7 form by:
  //   openssl crl2pkcs7 -inform DER -in secureca.crl
  TestCRLReparse(
      bssl::StringAsBytes(GetTestData("crypto/pkcs7/test/openssl_crl.p7c")));
}